

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cc
# Opt level: O0

void __thiscall re2c::Node::Node(Node *this)

{
  rule_rank_t r;
  Node *this_local;
  
  (this->arcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->arcs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->arcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->arcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this->arcs)._M_t._M_impl = 0;
  *(undefined8 *)&(this->arcs)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  std::
  map<re2c::Node_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<re2c::Node_*>,_std::allocator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::map(&this->arcs);
  (this->arcsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->arcsets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->arcsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->arcsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this->arcsets)._M_t._M_impl = 0;
  *(undefined8 *)&(this->arcsets)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  std::
  map<re2c::Node_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<re2c::Node_*>,_std::allocator<std::pair<re2c::Node_*const,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>_>
  ::map(&this->arcsets);
  this->loop = '\0';
  r = rule_rank_t::none();
  rule_t::rule_t(&this->rule,r,false);
  this->ctx = false;
  this->dist = 0xffffffff;
  memset(&this->reachable,0,0x30);
  std::set<re2c::rule_t,_std::less<re2c::rule_t>,_std::allocator<re2c::rule_t>_>::set
            (&this->reachable);
  this->suffix = (path_t *)0x0;
  return;
}

Assistant:

Node::Node ()
	: arcs ()
	, arcsets ()
	, loop (0)
	, rule (rule_rank_t::none (), false)
	, ctx (false)
	, dist (DIST_ERROR)
	, reachable ()
	, suffix (NULL)
{}